

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_unpack(char *infits,char *outfits)

{
  fitsfile *pfVar1;
  fitsfile *pfVar2;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  long lVar6;
  int stat_00;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char *unaff_R13;
  bool bVar9;
  byte bVar10;
  undefined8 in_stack_00000078;
  char in_stack_00000295;
  undefined8 auStack_908 [213];
  int stat;
  fitsfile *infptr;
  int hdutype;
  fitsfile *outfptr;
  char *loc;
  char hduname [513];
  
  bVar10 = 0;
  stat = 0;
  bVar9 = false;
  ffopentest(10,&infptr,infits,0,&stat);
  ffinit(&outfptr,outfits,&stat);
  if (stat != 0) {
    fp_abort_output(infptr,outfptr,stat);
  }
  if (in_stack_00000295 != '\0') {
    pcVar3 = strchr(&stack0x00000295,0x2c);
    bVar9 = pcVar3 == (char *)0x0;
    loc = pcVar3;
    if (bVar9) {
      strcpy(hduname,&stack0x00000295);
      sVar4 = strlen(hduname);
      unaff_R13 = &stack0x00000295 + sVar4;
    }
    else {
      *pcVar3 = '\0';
      strcpy(hduname,&stack0x00000295);
      unaff_R13 = pcVar3 + 1;
    }
    ppuVar5 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar5 + (long)hduname[0] * 2 + 1) & 8) == 0) ||
       (lVar6 = strtol(hduname,&loc,10), *loc != '\0')) {
      hdutype = 0;
      ffmnhd(infptr,0,hduname,0,&stat);
    }
    else {
      ffmahd(infptr,(int)lVar6 + 1,&hdutype,&stat);
      if (hdutype != 0) {
        stat = 0xe9;
        goto LAB_001095aa;
      }
    }
  }
  if (stat == 0) {
    stat_00 = 0;
    while( true ) {
      while( true ) {
        while( true ) {
          pfVar2 = outfptr;
          pfVar1 = infptr;
          if (stat_00 != 0) {
            if (stat_00 == 0x6b) {
              stat = 0;
              stat_00 = 0;
            }
            if (in_stack_00000078._4_4_ != 0) {
              ffmahd(outfptr,1,(int *)0x0,&stat);
              ffpcks(outfptr,&stat);
              stat_00 = stat;
            }
            if (stat_00 != 0) {
              fp_abort_output(infptr,outfptr,stat_00);
            }
            ffclos(outfptr,&stat);
            ffclos(infptr,&stat);
            return 0;
          }
          if (bVar9) {
            stat = -1;
          }
          puVar7 = (undefined8 *)&stack0x00000008;
          puVar8 = auStack_908;
          for (lVar6 = 0xd5; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar8 = *puVar7;
            puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
            puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
          }
          fp_unpack_hdu(pfVar1,pfVar2,&stat);
          if (in_stack_00000078._4_4_ != 0) {
            ffpcks(outfptr,&stat);
          }
          if (in_stack_00000295 != '\0') break;
          ffmrhd(infptr,1,(int *)0x0,&stat);
          stat_00 = stat;
        }
        if (*unaff_R13 != '\0') break;
        stat = 0x6b;
        stat_00 = stat;
      }
      pcVar3 = strchr(unaff_R13,0x2c);
      loc = pcVar3;
      if (pcVar3 == (char *)0x0) {
        strcpy(hduname,unaff_R13);
        *unaff_R13 = '\0';
      }
      else {
        *pcVar3 = '\0';
        strcpy(hduname,unaff_R13);
        unaff_R13 = pcVar3 + 1;
      }
      ppuVar5 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar5 + (long)hduname[0] * 2 + 1) & 8) != 0) &&
         (lVar6 = strtol(hduname,&loc,10), *loc == '\0')) break;
      hdutype = 0;
      ffmnhd(infptr,0,hduname,0,&stat);
LAB_0010947b:
      stat_00 = stat;
      if (stat != 0) {
LAB_00109485:
        fp_msg("Unable to find and move to extension \'");
        fp_msg(hduname);
        fp_msg("\'\n");
        stat_00 = stat;
      }
    }
    ffmahd(infptr,(int)lVar6 + 1,&hdutype,&stat);
    if (hdutype == 0) goto LAB_0010947b;
    stat = 0xe9;
    goto LAB_00109485;
  }
LAB_001095aa:
  fp_msg("Unable to find and move to extension \'");
  fp_msg(hduname);
  fp_msg("\'\n");
  fp_abort_output(infptr,outfptr,stat);
}

Assistant:

int fp_unpack (char *infits, char *outfits, fpstate fpvar)
{
        fitsfile *infptr, *outfptr;
        int stat=0, hdutype, extnum, single = 0;
	char *loc, *hduloc, hduname[SZ_STR];

        fits_open_file (&infptr, infits, READONLY, &stat);
        fits_create_file (&outfptr, outfits, &stat);

	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

        if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

            /* move to the first HDU in the list */
	    hduloc = fpvar.extname;
	    loc = strchr(hduloc, ','); /* look for 'comma' delimiter between names */
	    
	    if (loc)         
	        *loc = '\0';  /* terminate the first name in the string */

	    strcpy(hduname, hduloc);  /* copy the first name into temporary string */

	    if (loc)        
	        hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
            else {
	        hduloc += strlen(hduname);  /* end of the list */
	        single = 1;  /* only 1 HDU is being unpacked */
            }

            if (isdigit( (int) hduname[0]) ) {
	       extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

               /* check for junk following the integer */
               if (*loc == '\0' )  /* no junk, so move to this HDU number (+1) */
               {	       
                  fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                  if (hdutype != IMAGE_HDU)
		     stat = NOT_IMAGE;

               } else {  /* the string is not an integer, so must be the column name */
	          hdutype = IMAGE_HDU;
	          fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	       }
            }
	    else
	    {
                /* move to the named image extension */
  	        hdutype = IMAGE_HDU;
	        fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
            }
        }

        if (stat) {
	  fp_msg ("Unable to find and move to extension '");
          fp_msg(hduname);
	  fp_msg("'\n");
	  fp_abort_output(infptr, outfptr, stat);
        }

        while (! stat) {
	
	    if (single)
	        stat = -1;  /* special status flag to force output primary array */

            fp_unpack_hdu (infptr, outfptr, fpvar, &stat);

	    if (fpvar.do_checksums) {
	        fits_write_chksum (outfptr, &stat);
	    }

	    /* move to the next HDU */
            if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

                if (!(*hduloc)) {
		    stat = END_OF_FILE;  /* we reached the end of the list */
		} else {
		    /* parse the next HDU name and move to it */
	            loc = strchr(hduloc, ',');
	    
	            if (loc)         /* look for 'comma' delimiter between names */
	               *loc = '\0';  /* terminate the first name in the string */

	            strcpy(hduname, hduloc);  /* copy the next name into temporary string */

	            if (loc)         
	                hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
                    else
	               *hduloc = '\0';  /* end of the list */

                    if (isdigit( (int) hduname[0]) ) {
	               extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

                      /* check for junk following the integer */
                      if (*loc == '\0' )   /* no junk, so move to this HDU number (+1) */
		      {	       
                        fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                        if (hdutype != IMAGE_HDU)
		        stat = NOT_IMAGE;

                      } else {  /* the string is not an integer, so must be the column name */
	                hdutype = IMAGE_HDU;
	                fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	              }

                    } else {
                      /* move to the named image extension */
  	              hdutype = IMAGE_HDU;
	              fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
                   }

                   if (stat) {
	              fp_msg ("Unable to find and move to extension '");
                      fp_msg(hduname);
	              fp_msg("'\n");
                   }
                }
            } else {
                /* increment to the next HDU */
                fits_movrel_hdu (infptr, 1, NULL, &stat);
            }
        }

        if (stat == END_OF_FILE) stat = 0;

        /* set checksum for case of newly created primary HDU
         */
	if (fpvar.do_checksums) {
	    fits_movabs_hdu (outfptr, 1, NULL, &stat);
	    fits_write_chksum (outfptr, &stat);
	}


	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	fits_close_file (outfptr, &stat);
	fits_close_file (infptr, &stat);

	return(0);
}